

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsIteratorMutableExplicitCRbeginCRend(void)

{
  initializer_list<int> __l;
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  undefined1 local_88 [16];
  reverse_iterator<const_int_*> itr;
  int counter;
  Span<int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
            ((vector<int,_std::allocator<int>_> *)local_28);
  itr.current._4_4_ = 4;
  MILBlob::Util::Span<int,_18446744073709551615UL>::crbegin
            ((Span<int,_18446744073709551615UL> *)(local_88 + 8));
  do {
    MILBlob::Util::Span<int,_18446744073709551615UL>::crend
              ((Span<int,_18446744073709551615UL> *)local_88);
    bVar1 = std::operator!=((reverse_iterator<const_int_*> *)(local_88 + 8),
                            (reverse_iterator<const_int_*> *)local_88);
    if (!bVar1) {
      if (itr.current._4_4_ == 0) {
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b8);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(counter) == (0)");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
LAB_001d5d52:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28)
      ;
      return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
    }
    piVar2 = std::reverse_iterator<const_int_*>::operator*
                       ((reverse_iterator<const_int_*> *)(local_88 + 8));
    if (*piVar2 != itr.current._4_4_) {
      itr.current._4_4_ = itr.current._4_4_ + -1;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b6);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(*itr) == (counter--)");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001d5d52;
    }
    itr.current._4_4_ = itr.current._4_4_ + -1;
    std::reverse_iterator<const_int_*>::operator++((reverse_iterator<const_int_*> *)(local_88 + 8));
  } while( true );
}

Assistant:

int testSpanTestsIteratorMutableExplicitCRbeginCRend()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 4;
    for (auto itr = span.crbegin(); itr != span.crend(); ++itr) {
        static_assert(std::is_same<decltype(*itr), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(*itr, counter--);
    }
    ML_ASSERT_EQ(counter, 0);

    return 0;
}